

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,optional<bool> *target,string_view name,
          string_view value)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ushort uVar2;
  ushort uVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  string_view fmt;
  format_args args;
  string local_78;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 0x100;
  uVar2 = 1;
  if (value._M_len != 0) {
    __y._M_str = "True";
    __y._M_len = 4;
    bVar1 = std::operator==(value,__y);
    if (!bVar1) {
      __y_00._M_str = "true";
      __y_00._M_len = 4;
      bVar1 = std::operator==(value,__y_00);
      if (!bVar1) {
        __y_01._M_str = "False";
        __y_01._M_len = 5;
        bVar1 = std::operator==(value,__y_01);
        if (!bVar1) {
          __y_02._M_str = "false";
          __y_02._M_len = 5;
          bVar1 = std::operator==(value,__y_02);
          if (!bVar1) {
            local_58 = value._M_str;
            local_50 = value._M_len;
            fmt.size_ = 0xdd;
            fmt.data_ = (char *)0x2c;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)&local_58;
            local_48 = name._M_str;
            local_40 = name._M_len;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_78,(v11 *)"invalid value \'{}\' for boolean argument \'{}\'",fmt,args)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(__return_storage_ptr__,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            uVar2 = 0;
            uVar3 = 0;
            goto LAB_001c2edb;
          }
        }
        uVar2 = 0;
      }
    }
  }
LAB_001c2edb:
  (target->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload_base<bool>)(uVar3 | uVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<bool>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseBool(name, value, error);
    return error;
}